

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::OutputFile::copyPixels(OutputFile *this,InputFile *in)

{
  LineOrder LVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 uVar6;
  LineOrder *pLVar7;
  Compression *pCVar8;
  long in_RDI;
  int pixelDataSize;
  char *pixelData;
  stringstream _iex_throw_s_5;
  Box2i *dataWindow;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  Header *inHdr;
  Header *hdr;
  lock_guard<std::mutex> lock;
  Header *in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  int in_stack_fffffffffffff464;
  Box<Imath_3_1::Vec2<int>_> *in_stack_fffffffffffff468;
  Vec2<int> in_stack_fffffffffffff470;
  undefined4 in_stack_fffffffffffff478;
  undefined8 in_stack_fffffffffffff480;
  Data *in_stack_fffffffffffff488;
  OutputStreamMutex *in_stack_fffffffffffff490;
  ChannelList *in_stack_fffffffffffff4a0;
  ChannelList *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  Compression CVar9;
  Header *in_stack_fffffffffffff568;
  stringstream local_980 [16];
  ostream local_970 [376];
  Box2i *local_7f8;
  stringstream local_7f0 [16];
  ostream local_7e0 [376];
  stringstream local_668 [16];
  ostream local_658 [376];
  stringstream local_4e0 [16];
  ostream local_4d0 [376];
  stringstream local_358 [16];
  ostream local_348 [376];
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  const_iterator local_48;
  const_iterator local_40;
  Header *local_28;
  undefined8 local_20;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460)
             ,(mutex_type *)in_stack_fffffffffffff458);
  local_20 = *(undefined8 *)(in_RDI + 8);
  local_28 = InputFile::header((InputFile *)in_stack_fffffffffffff458);
  local_40._M_node =
       (_Base_ptr)
       Header::find(in_stack_fffffffffffff568,
                    (char *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  local_48._M_node = (_Base_ptr)Header::end(in_stack_fffffffffffff458);
  bVar2 = Imf_3_3::operator!=((ConstIterator *)
                              CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                              (ConstIterator *)in_stack_fffffffffffff458);
  if (bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar4 = std::operator<<(local_1c0,"Cannot copy pixels from image file \"");
    pcVar5 = InputFile::fileName((InputFile *)0xb4eb90);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" to image file \"");
    pcVar5 = fileName((OutputFile *)0xb4ebe4);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,
                    "\". The input file is tiled, but the output file is not. Try using TiledOutputFile::copyPixels instead."
                   );
    uVar6 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
               (stringstream *)in_stack_fffffffffffff458);
    __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  Header::dataWindow((Header *)0xb4ecd9);
  Header::dataWindow((Header *)0xb4ecf0);
  bVar2 = Imath_3_1::Box<Imath_3_1::Vec2<int>_>::operator==
                    ((Box<Imath_3_1::Vec2<int>_> *)in_stack_fffffffffffff470,
                     in_stack_fffffffffffff468);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_358);
    poVar4 = std::operator<<(local_348,"Cannot copy pixels from image file \"");
    pcVar5 = InputFile::fileName((InputFile *)0xb4ed5a);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" to image file \"");
    pcVar5 = fileName((OutputFile *)0xb4edae);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\". The files have different data windows.");
    uVar6 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
               (stringstream *)in_stack_fffffffffffff458);
    __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  pLVar7 = Header::lineOrder((Header *)0xb4ee8a);
  LVar1 = *pLVar7;
  pLVar7 = Header::lineOrder((Header *)0xb4eeb2);
  if (LVar1 != *pLVar7) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4e0);
    poVar4 = std::operator<<(local_4d0,"Quick pixel copy from image file \"");
    pcVar5 = InputFile::fileName((InputFile *)0xb4ef16);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" to image file \"");
    pcVar5 = fileName((OutputFile *)0xb4ef6a);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\" failed. The files have different line orders.");
    uVar6 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
               (stringstream *)in_stack_fffffffffffff458);
    __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  pCVar8 = Header::compression((Header *)0xb4f046);
  CVar9 = *pCVar8;
  pCVar8 = Header::compression((Header *)0xb4f06e);
  if (CVar9 == *pCVar8) {
    Header::channels((Header *)0xb4f202);
    Header::channels((Header *)0xb4f219);
    bVar2 = ChannelList::operator==(in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    if (!bVar2) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_7f0);
      poVar4 = std::operator<<(local_7e0,"Quick pixel copy from image file \"");
      pcVar5 = InputFile::fileName((InputFile *)0xb4f295);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"\" to image file \"");
      pcVar5 = fileName((OutputFile *)0xb4f2e9);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::operator<<(poVar4,"\" failed.  The files have different channel lists.");
      uVar6 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                ((ArgExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                 (stringstream *)in_stack_fffffffffffff458);
      __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_7f8 = Header::dataWindow((Header *)0xb4f3c5);
    if (*(int *)(*(long *)(in_RDI + 8) + 0x7c) == ((local_7f8->max).y - (local_7f8->min).y) + 1) {
      while (0 < *(int *)(*(long *)(in_RDI + 8) + 0x7c)) {
        InputFile::rawPixelData
                  ((InputFile *)in_stack_fffffffffffff470,
                   (int)((ulong)in_stack_fffffffffffff468 >> 0x20),
                   (char **)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
                   (int *)in_stack_fffffffffffff458);
        in_stack_fffffffffffff468 = *(Box<Imath_3_1::Vec2<int>_> **)(in_RDI + 8);
        in_stack_fffffffffffff470 = in_stack_fffffffffffff468[0x13].max;
        iVar3 = lineBufferMinY(in_stack_fffffffffffff468[7].max.x,in_stack_fffffffffffff468[8].max.y
                               ,in_stack_fffffffffffff468[0x12].min.x);
        anon_unknown_6::writePixelData
                  (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                   (int)((ulong)in_stack_fffffffffffff480 >> 0x20),
                   (char *)CONCAT44(iVar3,in_stack_fffffffffffff478),in_stack_fffffffffffff470.y);
        if (*(int *)(*(long *)(in_RDI + 8) + 0x80) == 0) {
          in_stack_fffffffffffff464 = *(int *)(*(long *)(in_RDI + 8) + 0x120);
        }
        else {
          in_stack_fffffffffffff464 = -*(int *)(*(long *)(in_RDI + 8) + 0x120);
        }
        *(int *)(*(long *)(in_RDI + 8) + 0x78) =
             in_stack_fffffffffffff464 + *(int *)(*(long *)(in_RDI + 8) + 0x78);
        *(int *)(*(long *)(in_RDI + 8) + 0x7c) =
             *(int *)(*(long *)(in_RDI + 8) + 0x7c) - *(int *)(*(long *)(in_RDI + 8) + 0x120);
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xb4f6a9);
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_980);
    poVar4 = std::operator<<(local_970,"Quick pixel copy from image file \"");
    pcVar5 = InputFile::fileName((InputFile *)0xb4f449);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" to image file \"");
    pcVar5 = fileName((OutputFile *)0xb4f48b);
    poVar4 = std::operator<<(poVar4,pcVar5);
    poVar4 = std::operator<<(poVar4,"\" failed. \"");
    pcVar5 = fileName((OutputFile *)0xb4f4cd);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\" already contains pixel data.");
    uVar6 = __cxa_allocate_exception(0x48);
    Iex_3_3::LogicExc::LogicExc
              ((LogicExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
               (stringstream *)in_stack_fffffffffffff458);
    __cxa_throw(uVar6,&Iex_3_3::LogicExc::typeinfo,Iex_3_3::LogicExc::~LogicExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_668);
  poVar4 = std::operator<<(local_658,"Quick pixel copy from image file \"");
  pcVar5 = InputFile::fileName((InputFile *)0xb4f0d2);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"\" to image file \"");
  pcVar5 = fileName((OutputFile *)0xb4f126);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\" failed. The files use different compression methods.");
  uVar6 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)CONCAT44(in_stack_fffffffffffff464,in_stack_fffffffffffff460),
             (stringstream *)in_stack_fffffffffffff458);
  __cxa_throw(uVar6,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
OutputFile::copyPixels (InputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (inHdr.find ("tiles") != inHdr.end ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The input file is tiled, but the output file is "
                   "not. Try using TiledOutputFile::copyPixels "
                   "instead.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". "
                   "The files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed.  "
                   "The files have different channel lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    const Box2i& dataWindow = hdr.dataWindow ();

    if (_data->missingScanLines != dataWindow.max.y - dataWindow.min.y + 1)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "\""
                << fileName ()
                << "\" already contains "
                   "pixel data.");

    //
    // Copy the pixel data.
    //

    while (_data->missingScanLines > 0)
    {
        const char* pixelData;
        int         pixelDataSize;

        in.rawPixelData (_data->currentScanLine, pixelData, pixelDataSize);

        writePixelData (
            _data->_streamData,
            _data,
            lineBufferMinY (
                _data->currentScanLine, _data->minY, _data->linesInBuffer),
            pixelData,
            pixelDataSize);

        _data->currentScanLine += (_data->lineOrder == INCREASING_Y)
                                      ? _data->linesInBuffer
                                      : -_data->linesInBuffer;

        _data->missingScanLines -= _data->linesInBuffer;
    }
}